

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strpool.h
# Opt level: O0

void strpool_term(strpool_t *pool)

{
  int local_14;
  int i;
  strpool_t *pool_local;
  
  for (local_14 = 0; local_14 < pool->block_count; local_14 = local_14 + 1) {
    sx__free((sx_alloc *)pool->memctx,pool->blocks[local_14].data,0,(char *)0x0,(char *)0x0,0);
  }
  sx__free((sx_alloc *)pool->memctx,pool->blocks,0,(char *)0x0,(char *)0x0,0);
  sx__free((sx_alloc *)pool->memctx,pool->handles,0,(char *)0x0,(char *)0x0,0);
  sx__free((sx_alloc *)pool->memctx,pool->entries,0,(char *)0x0,(char *)0x0,0);
  sx__free((sx_alloc *)pool->memctx,pool->hash_table,0,(char *)0x0,(char *)0x0,0);
  return;
}

Assistant:

void strpool_term( strpool_t* pool )
    {
#if 0
    // Debug statistics
    printf( "\n\n" );
    printf( "Handles: %d/%d\n", pool->handle_count, pool->handle_capacity );
    printf( "Entries: %d/%d\n", pool->entry_count, pool->entry_capacity );
    printf( "Hashtable: %d/%d\n", pool->entry_count, pool->hash_capacity );
    printf( "Blocks: %d/%d\n", pool->block_count, pool->block_capacity );
    for( int i = 0; i < pool->block_count; ++i )
        {
        printf( "\n" );
        printf( "BLOCK: %d\n", i );
        printf( "Capacity: %d\n", pool->blocks[ i ].capacity );
        printf( "Free: [ %d ]", pool->blocks[ i ].capacity - ( pool->blocks[ i ].tail - pool->blocks[ i ].data ) );
        int fl = pool->blocks[ i ].free_list;
        int count = 0;
        int size = 0;
        int total = 0;
        while( fl >= 0 )
            {
            strpool_free_block_t* free_entry = (strpool_free_block_t*) ( pool->blocks[ i ].data + fl );
            total += free_entry->size;
            if( size == 0 ) { size = free_entry->size; }
            if( size != free_entry->size )
                {
                printf( ", %dx%d", count, size );
                count = 1;
                size = free_entry->size;
                }
            else
                {
                ++count;
                }
            fl = free_entry->next;
            }
        if( size != 0 ) printf( ", %dx%d", count, size );
        printf( ", { %d }\n", total );
        }
    printf( "\n\n" );
#endif

    for( int i = 0; i < pool->block_count; ++i ) STRPOOL_FREE( pool->memctx, pool->blocks[ i ].data );
    STRPOOL_FREE( pool->memctx, pool->blocks );         
    STRPOOL_FREE( pool->memctx, pool->handles );            
    STRPOOL_FREE( pool->memctx, pool->entries );            
    STRPOOL_FREE( pool->memctx, pool->hash_table );         
    }